

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::statement<char_const(&)[57]>(CompilerGLSL *this,char (*ts) [57])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  char (*ts_00) [57];
  uint32_t i;
  uint uVar2;
  string sStack_48;
  
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (!bVar1) {
    this_00 = this->redirect_statement;
    if (this_00 ==
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)0x0) {
      for (uVar2 = 0; uVar2 < this->indent; uVar2 = uVar2 + 1) {
        StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
      }
      statement_inner<char_const(&)[57]>(this,ts);
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
      return;
    }
    join<char_const(&)[57]>(&sStack_48,(spirv_cross *)ts,ts_00);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,&sStack_48);
    ::std::__cxx11::string::~string((string *)&sStack_48);
  }
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}